

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum.cpp
# Opt level: O0

string * __thiscall camp::Enum::name_abi_cxx11_(Enum *this,long value)

{
  ValueIndex *value_00;
  bool bVar1;
  EnumValueNotFound *__return_storage_ptr__;
  string *enumName;
  Pair *pPVar2;
  allocator local_d1;
  string local_d0 [39];
  allocator local_a9;
  string local_a8 [48];
  EnumValueNotFound local_78;
  bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<camp::Enum::Pair,_std::allocator<camp::Enum::Pair>_>_>_>_>
  local_30;
  bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<camp::Enum::Pair,_std::allocator<camp::Enum::Pair>_>_>_>_>
  local_28;
  const_iterator it;
  ValueIndex *values;
  long value_local;
  Enum *this_local;
  
  values = (ValueIndex *)value;
  value_local = (long)this;
  it.node = (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<camp::Enum::Pair,_std::allocator<camp::Enum::Pair>_>_>_>
             *)boost::multi_index::
               multi_index_container<camp::Enum::Pair,_boost::multi_index::indexed_by<boost::multi_index::random_access<boost::multi_index::tag<camp::Enum::Id,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>_>,_boost::multi_index::ordered_unique<boost::multi_index::tag<camp::Enum::Val,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::member<camp::Enum::Pair,_long,_&camp::Enum::Pair::value>,_mpl_::na>,_boost::multi_index::ordered_unique<boost::multi_index::tag<camp::Enum::Name,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::member<camp::Enum::Pair,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&camp::Enum::Pair::name>,_mpl_::na>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<camp::Enum::Pair>_>
               ::get<camp::Enum::Val>(&this->m_pairs);
  local_28.node =
       (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<camp::Enum::Pair,_std::allocator<camp::Enum::Pair>_>_>_>
        *)boost::multi_index::detail::
          ordered_index_impl<boost::multi_index::member<camp::Enum::Pair,_long,_&camp::Enum::Pair::value>,_std::less<long>,_boost::multi_index::detail::nth_layer<2,_camp::Enum::Pair,_boost::multi_index::indexed_by<boost::multi_index::random_access<boost::multi_index::tag<camp::Enum::Id,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>_>,_boost::multi_index::ordered_unique<boost::multi_index::tag<camp::Enum::Val,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::member<camp::Enum::Pair,_long,_&camp::Enum::Pair::value>,_mpl_::na>,_boost::multi_index::ordered_unique<boost::multi_index::tag<camp::Enum::Name,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::member<camp::Enum::Pair,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&camp::Enum::Pair::name>,_mpl_::na>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<camp::Enum::Pair>_>,_boost::mpl::v_item<camp::Enum::Val,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::ordered_unique_tag,_boost::multi_index::detail::null_augment_policy>
          ::find<long>((ordered_index_impl<boost::multi_index::member<camp::Enum::Pair,_long,_&camp::Enum::Pair::value>,_std::less<long>,_boost::multi_index::detail::nth_layer<2,_camp::Enum::Pair,_boost::multi_index::indexed_by<boost::multi_index::random_access<boost::multi_index::tag<camp::Enum::Id,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>_>,_boost::multi_index::ordered_unique<boost::multi_index::tag<camp::Enum::Val,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::member<camp::Enum::Pair,_long,_&camp::Enum::Pair::value>,_mpl_::na>,_boost::multi_index::ordered_unique<boost::multi_index::tag<camp::Enum::Name,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::member<camp::Enum::Pair,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&camp::Enum::Pair::name>,_mpl_::na>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<camp::Enum::Pair>_>,_boost::mpl::v_item<camp::Enum::Val,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::ordered_unique_tag,_boost::multi_index::detail::null_augment_policy>
                        *)it.node,(long *)&values);
  local_30.node =
       (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<camp::Enum::Pair,_std::allocator<camp::Enum::Pair>_>_>_>
        *)boost::multi_index::detail::
          ordered_index_impl<boost::multi_index::member<camp::Enum::Pair,_long,_&camp::Enum::Pair::value>,_std::less<long>,_boost::multi_index::detail::nth_layer<2,_camp::Enum::Pair,_boost::multi_index::indexed_by<boost::multi_index::random_access<boost::multi_index::tag<camp::Enum::Id,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>_>,_boost::multi_index::ordered_unique<boost::multi_index::tag<camp::Enum::Val,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::member<camp::Enum::Pair,_long,_&camp::Enum::Pair::value>,_mpl_::na>,_boost::multi_index::ordered_unique<boost::multi_index::tag<camp::Enum::Name,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_boost::multi_index::member<camp::Enum::Pair,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_&camp::Enum::Pair::name>,_mpl_::na>,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na,_mpl_::na>,_std::allocator<camp::Enum::Pair>_>,_boost::mpl::v_item<camp::Enum::Val,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::ordered_unique_tag,_boost::multi_index::detail::null_augment_policy>
          ::end(it.node);
  bVar1 = boost::multi_index::detail::operator==(&local_28,&local_30);
  if (!bVar1) {
    pPVar2 = boost::operators_impl::
             dereferenceable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<camp::Enum::Pair,_std::allocator<camp::Enum::Pair>_>_>_>_>,_const_camp::Enum::Pair_*,_boost::operators_impl::decrementable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<camp::Enum::Pair,_std::allocator<camp::Enum::Pair>_>_>_>_>,_boost::operators_impl::iterator_helper<std::bidirectional_iterator_tag,_camp::Enum::Pair,_long,_const_camp::Enum::Pair_*,_const_camp::Enum::Pair_&>_>_>
             ::operator->((dereferenceable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<camp::Enum::Pair,_std::allocator<camp::Enum::Pair>_>_>_>_>,_const_camp::Enum::Pair_*,_boost::operators_impl::decrementable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<camp::Enum::Pair,_std::allocator<camp::Enum::Pair>_>_>_>_>,_boost::operators_impl::iterator_helper<std::bidirectional_iterator_tag,_camp::Enum::Pair,_long,_const_camp::Enum::Pair_*,_const_camp::Enum::Pair_&>_>_>
                           *)&local_28);
    return &pPVar2->name;
  }
  __return_storage_ptr__ = (EnumValueNotFound *)__cxa_allocate_exception(0x48);
  value_00 = values;
  enumName = name_abi_cxx11_(this);
  EnumValueNotFound::EnumValueNotFound(&local_78,(long)value_00,enumName);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_a8,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/fw4spl-org[P]camp/src/enum.cpp"
             ,&local_a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d0,"const std::string &camp::Enum::name(long) const",&local_d1)
  ;
  Error::prepare<camp::EnumValueNotFound>
            (__return_storage_ptr__,&local_78,(string *)local_a8,0x54,(string *)local_d0);
  __cxa_throw(__return_storage_ptr__,&EnumValueNotFound::typeinfo,
              EnumValueNotFound::~EnumValueNotFound);
}

Assistant:

const std::string& Enum::name(long value) const
{
    const ValueIndex& values = m_pairs.get<Val>();

    ValueIndex::const_iterator it = values.find(value);
    if (it == values.end())
        CAMP_ERROR(EnumValueNotFound(value, name()));

    return it->name;
}